

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.h
# Opt level: O2

void __thiscall pm::Sampler::~Sampler(Sampler *this)

{
  this->_vptr_Sampler = (_func_int **)&PTR__Sampler_00118ac8;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->shuffledIndices_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>::~_Vector_base
            (&(this->hemisphereSamples_).
              super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>);
  std::_Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>::~_Vector_base
            (&(this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>);
  std::_Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>::~_Vector_base
            (&(this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>);
  return;
}

Assistant:

virtual ~Sampler() {}